

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O3

bool __thiscall rcg::Buffer::getContainsChunkdata(Buffer *this)

{
  void *pvVar1;
  bool8_t ret;
  size_t size;
  INFO_DATATYPE type;
  byte local_19;
  size_t local_18;
  INFO_DATATYPE local_c;
  
  local_19 = 1;
  if (this->payload_type != 4) {
    pvVar1 = Stream::getHandle(this->parent);
    local_19 = 0;
    local_18 = 1;
    if (this->buffer == (BUFFER_HANDLE)0x0 || pvVar1 == (void *)0x0) {
      local_19 = 0;
    }
    else {
      (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->DSGetBufferInfo)(pvVar1,this->buffer,0x1e,&local_c,&local_19,&local_18);
    }
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool Buffer::getContainsChunkdata() const
{
  if (payload_type == PAYLOAD_TYPE_CHUNK_DATA)
  {
    return true;
  }

  return getBufferBool(gentl, parent->getHandle(), buffer,
                       GenTL::BUFFER_INFO_CONTAINS_CHUNKDATA);
}